

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_mu_timeout_stress_test.c
# Opt level: O3

void mu_stress_reader_loop(cv_stress_data *s,condition_func condition,void *condition_arg)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong unaff_RBX;
  ulong uVar4;
  nsync_time nVar5;
  nsync_time nVar6;
  
  nsync::nsync_mu_rlock(&s->mu);
  nsync::nsync_mu_rassert_held(&s->mu);
  if (s->refs == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      while( true ) {
        nsync::nsync_mu_rassert_held(&s->mu);
        nVar5 = nsync::nsync_time_now();
        iVar3 = rand();
        nVar6 = nsync::nsync_time_us(iVar3 % 4000);
        nVar5 = nsync::nsync_time_add(nVar5,nVar6);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = unaff_RBX;
        iVar3 = nsync::nsync_mu_wait_with_deadline
                          ((nsync *)s,(nsync_mu *)condition,(_func_int_void_ptr *)condition_arg,
                           (void *)0x0,(_func_int_void_ptr_void_ptr *)nVar5.tv_sec,
                           (nsync_time)(auVar2 << 0x40),(nsync_note)nVar5.tv_nsec);
        if (iVar3 == 0) break;
        nsync::nsync_mu_rassert_held(&s->mu);
        s->timeouts = s->timeouts + 1;
      }
      nsync::nsync_mu_rassert_held(&s->mu);
      uVar4 = uVar4 + 1;
      if ((uVar4 & 0xf) == 0) {
        nsync::nsync_mu_runlock(&s->mu);
        if ((uVar4 & 0xff0) == 0) {
          nVar5 = nsync::nsync_time_ms(1);
          nVar6.tv_nsec = nVar5.tv_nsec;
          nVar6.tv_sec = nVar6.tv_nsec;
          nsync::nsync_time_sleep((nsync *)nVar5.tv_sec,nVar6);
        }
        nsync::nsync_mu_rlock(&s->mu);
      }
    } while (s->refs != 0);
  }
  nsync::nsync_mu_rassert_held(&s->mu);
  nsync::nsync_mu_runlock(&s->mu);
  nsync::nsync_mu_lock(&s->mu);
  s->reader_loops = s->reader_loops + uVar4;
  puVar1 = &s->reader_refs;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    nsync::nsync_cv_signal(&s->reader_refs_is_zero);
  }
  nsync::nsync_mu_assert_held(&s->mu);
  nsync::nsync_mu_unlock(&s->mu);
  return;
}

Assistant:

static void mu_stress_reader_loop (cv_stress_data *s, condition_func condition,
				   const void *condition_arg) {
	uintmax_t loops;
	uintmax_t timeouts = 0;
	nsync_mu_rlock (&s->mu);
	nsync_mu_rassert_held (&s->mu);
	loops = 0;
	while (s->refs != 0) {
		nsync_time abs_deadline;
		nsync_mu_rassert_held (&s->mu);
		abs_deadline = nsync_time_add (nsync_time_now (),
			nsync_time_us (rand () % STRESS_MAX_DELAY_MICROS));
		while (nsync_mu_wait_with_deadline (&s->mu, condition, condition_arg, NULL,
						    abs_deadline, NULL) != 0) {
			nsync_mu_rassert_held (&s->mu);
			s->timeouts++;
			nsync_mu_rassert_held (&s->mu);
			abs_deadline = nsync_time_add (nsync_time_now (),
				nsync_time_us (rand () % STRESS_MAX_DELAY_MICROS));
		}

		nsync_mu_rassert_held (&s->mu);
		loops++;
		if ((loops & 0xf) == 0) {
			nsync_mu_runlock (&s->mu);
			if ((loops & 0xfff) == 0) {
				nsync_time_sleep (nsync_time_ms (1));
			}
			nsync_mu_rlock (&s->mu);
		}
	}
	nsync_mu_rassert_held (&s->mu);
	nsync_mu_runlock (&s->mu);

	nsync_mu_lock (&s->mu);
	s->reader_loops += loops;
	s->timeouts += timeouts;
	s->reader_refs--;
	if (s->reader_refs == 0) {
		nsync_cv_signal (&s->reader_refs_is_zero);
	}
	nsync_mu_assert_held (&s->mu);
	nsync_mu_unlock (&s->mu);
}